

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O1

void __thiscall ncnn::ParamDict::set(ParamDict *this,int id,Mat *v)

{
  anon_struct_72_3_b6d6cd30 *paVar1;
  int *piVar2;
  void *__ptr;
  Allocator *pAVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  
  paVar1 = this->params + id;
  paVar1->type = 4;
  if (&paVar1->v != v) {
    piVar2 = v->refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    piVar2 = this->params[id].v.refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        __ptr = this->params[id].v.data;
        pAVar3 = this->params[id].v.allocator;
        if (pAVar3 == (Allocator *)0x0) {
          if (__ptr != (void *)0x0) {
            free(__ptr);
          }
        }
        else {
          (**(code **)(*(long *)pAVar3 + 0x18))();
        }
      }
    }
    *(undefined8 *)((long)&(paVar1->v).refcount + 4) = 0;
    *(undefined8 *)((long)&(paVar1->v).elemsize + 4) = 0;
    (paVar1->v).data = (void *)0x0;
    (paVar1->v).refcount = (int *)0x0;
    this->params[id].v.dims = 0;
    this->params[id].v.w = 0;
    this->params[id].v.h = 0;
    this->params[id].v.c = 0;
    this->params[id].v.cstep = 0;
    piVar2 = v->refcount;
    this->params[id].v.data = v->data;
    this->params[id].v.refcount = piVar2;
    this->params[id].v.elemsize = v->elemsize;
    this->params[id].v.elempack = v->elempack;
    this->params[id].v.allocator = v->allocator;
    iVar4 = v->w;
    iVar5 = v->h;
    iVar6 = v->c;
    this->params[id].v.dims = v->dims;
    this->params[id].v.w = iVar4;
    this->params[id].v.h = iVar5;
    this->params[id].v.c = iVar6;
    this->params[id].v.cstep = v->cstep;
  }
  return;
}

Assistant:

void ParamDict::set(int id, const Mat& v)
{
    params[id].type = 4;
    params[id].v = v;
}